

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O0

void Tests::AddExpressionEvaluionFail(char *reason)

{
  int iVar1;
  char *pcVar2;
  uint local_14;
  uint i;
  char *reason_local;
  
  local_14 = 0;
  while( true ) {
    if (expressionEvaluionFails <= local_14) {
      if (expressionEvaluionFails < 0x80) {
        if (expressionEvaluionFails < 0x80) {
          pcVar2 = strdup(reason);
          *(char **)(expressionEvaluionFailInfo + (ulong)expressionEvaluionFails * 0x10) = pcVar2;
          *(undefined4 *)(expressionEvaluionFailInfo + (ulong)expressionEvaluionFails * 0x10 + 8) =
               1;
          expressionEvaluionFails = expressionEvaluionFails + 1;
        }
        return;
      }
      __assert_fail("expressionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xd5,"void Tests::AddExpressionEvaluionFail(const char *)");
    }
    iVar1 = strcmp(*(char **)(expressionEvaluionFailInfo + (ulong)local_14 * 0x10),reason);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  *(int *)(expressionEvaluionFailInfo + (ulong)local_14 * 0x10 + 8) =
       *(int *)(expressionEvaluionFailInfo + (ulong)local_14 * 0x10 + 8) + 1;
  return;
}

Assistant:

void AddExpressionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < expressionEvaluionFails; i++)
		{
			if(strcmp(expressionEvaluionFailInfo[i].reason, reason) == 0)
			{
				expressionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(expressionEvaluionFails < 128);

		if(expressionEvaluionFails < 128)
		{
			expressionEvaluionFailInfo[expressionEvaluionFails].reason = strdup(reason);
			expressionEvaluionFailInfo[expressionEvaluionFails].count = 1;
			expressionEvaluionFails++;
		}
	}